

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O2

xmlParserInputPtr
xmlNewIOInputStream(xmlParserCtxtPtr ctxt,xmlParserInputBufferPtr input,xmlCharEncoding enc)

{
  xmlGenericErrorFunc p_Var1;
  int *piVar2;
  xmlGenericErrorFunc *pp_Var3;
  void **ppvVar4;
  xmlParserInputPtr input_00;
  
  if (input != (xmlParserInputBufferPtr)0x0) {
    piVar2 = __xmlParserDebugEntities();
    if (*piVar2 != 0) {
      pp_Var3 = __xmlGenericError();
      p_Var1 = *pp_Var3;
      ppvVar4 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar4,"new input from I/O\n");
    }
    input_00 = xmlNewInputStream(ctxt);
    if (input_00 != (xmlParserInputPtr)0x0) {
      input_00->filename = (char *)0x0;
      input_00->buf = input;
      xmlBufResetInput(input->buffer,input_00);
      if (enc == XML_CHAR_ENCODING_NONE) {
        return input_00;
      }
      xmlSwitchEncoding(ctxt,enc);
      return input_00;
    }
  }
  return (xmlParserInputPtr)0x0;
}

Assistant:

xmlParserInputPtr
xmlNewIOInputStream(xmlParserCtxtPtr ctxt, xmlParserInputBufferPtr input,
	            xmlCharEncoding enc) {
    xmlParserInputPtr inputStream;

    if (input == NULL) return(NULL);
    if (xmlParserDebugEntities)
	xmlGenericError(xmlGenericErrorContext, "new input from I/O\n");
    inputStream = xmlNewInputStream(ctxt);
    if (inputStream == NULL) {
	return(NULL);
    }
    inputStream->filename = NULL;
    inputStream->buf = input;
    xmlBufResetInput(inputStream->buf->buffer, inputStream);

    if (enc != XML_CHAR_ENCODING_NONE) {
        xmlSwitchEncoding(ctxt, enc);
    }

    return(inputStream);
}